

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipstream.cpp
# Opt level: O0

int64_t decodeInt(uint8_t **ptr)

{
  byte *pbVar1;
  ulong local_28;
  int64_t val;
  uint8_t sz;
  uint8_t *data;
  uint8_t **ptr_local;
  
  pbVar1 = *ptr;
  val._7_1_ = *pbVar1;
  *ptr = pbVar1 + (int)(val._7_1_ + 1);
  local_28 = 0;
  for (; val._7_1_ != 0; val._7_1_ = val._7_1_ - 1) {
    local_28 = (ulong)pbVar1[val._7_1_] | local_28 << 8;
  }
  return local_28;
}

Assistant:

int64_t decodeInt(uint8_t const** ptr)
{
    auto* data = *ptr;
    auto sz = data[0];
    *ptr = &data[sz + 1];
    int64_t val = 0;
    while (sz > 0) {
        val <<= 8;
        val |= data[sz];
        sz--;
    }
    return val;
}